

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlskey_openssl.cpp
# Opt level: O2

TlsKeyOpenSSL * QTlsPrivate::TlsKeyOpenSSL::publicKeyFromX509(X509 *x)

{
  KeyAlgorithm KVar1;
  int iVar2;
  TlsKeyOpenSSL *this;
  EVP_PKEY *pkey;
  RSA *pRVar3;
  pointer __p;
  long in_FS_OFFSET;
  __uniq_ptr_impl<QTlsPrivate::TlsKeyOpenSSL,_std::default_delete<QTlsPrivate::TlsKeyOpenSSL>_>
  local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this = (TlsKeyOpenSSL *)operator_new(0x20);
  TlsKeyOpenSSL(this);
  (this->super_TlsKeyBase).keyType = PublicKey;
  pkey = q_X509_get_pubkey(x);
  iVar2 = q_EVP_PKEY_get_base_id(pkey);
  iVar2 = q_EVP_PKEY_type(iVar2);
  if (iVar2 == 0x198) {
    pRVar3 = (RSA *)q_EVP_PKEY_get1_EC_KEY(pkey);
    KVar1 = Ec;
  }
  else if (iVar2 == 0x74) {
    pRVar3 = (RSA *)q_EVP_PKEY_get1_DSA(pkey);
    KVar1 = Dsa;
  }
  else {
    if (iVar2 != 6) goto LAB_00122c93;
    pRVar3 = q_EVP_PKEY_get1_RSA(pkey);
    KVar1 = Rsa;
  }
  (this->field_0).rsa = pRVar3;
  (this->super_TlsKeyBase).keyAlgorithm = KVar1;
  (this->super_TlsKeyBase).keyIsNull = false;
LAB_00122c93:
  q_EVP_PKEY_free(pkey);
  local_20._M_t.
  super__Tuple_impl<0UL,_QTlsPrivate::TlsKeyOpenSSL_*,_std::default_delete<QTlsPrivate::TlsKeyOpenSSL>_>
  .super__Head_base<0UL,_QTlsPrivate::TlsKeyOpenSSL_*,_false>._M_head_impl =
       (tuple<QTlsPrivate::TlsKeyOpenSSL_*,_std::default_delete<QTlsPrivate::TlsKeyOpenSSL>_>)
       (_Tuple_impl<0UL,_QTlsPrivate::TlsKeyOpenSSL_*,_std::default_delete<QTlsPrivate::TlsKeyOpenSSL>_>
        )0x0;
  std::unique_ptr<QTlsPrivate::TlsKeyOpenSSL,_std::default_delete<QTlsPrivate::TlsKeyOpenSSL>_>::
  ~unique_ptr((unique_ptr<QTlsPrivate::TlsKeyOpenSSL,_std::default_delete<QTlsPrivate::TlsKeyOpenSSL>_>
               *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

TlsKeyOpenSSL *TlsKeyOpenSSL::publicKeyFromX509(X509 *x)
{
    TlsKeyOpenSSL *tlsKey = new TlsKeyOpenSSL;
    std::unique_ptr<TlsKeyOpenSSL> keyRaii(tlsKey);

    tlsKey->keyType = QSsl::PublicKey;

#ifndef OPENSSL_NO_DEPRECATED_3_0

#define get_pubkey(keyName, alg) tlsKey->keyName = q_EVP_PKEY_get1_##alg(pkey)

#else

#define get_pubkey(a, b) tlsKey->genericKey = pkey

#endif

    EVP_PKEY *pkey = q_X509_get_pubkey(x);
    Q_ASSERT(pkey);
    const int keyType = q_EVP_PKEY_type(q_EVP_PKEY_base_id(pkey));

    if (keyType == EVP_PKEY_RSA) {
        get_pubkey(rsa, RSA);
        tlsKey->keyAlgorithm = QSsl::Rsa;
        tlsKey->keyIsNull = false;
    } else if (keyType == EVP_PKEY_DSA) {
        get_pubkey(dsa, DSA);
        tlsKey->keyAlgorithm = QSsl::Dsa;
        tlsKey->keyIsNull = false;
#ifndef OPENSSL_NO_EC
    } else if (keyType == EVP_PKEY_EC) {
        get_pubkey(ec, EC_KEY);
        tlsKey->keyAlgorithm = QSsl::Ec;
        tlsKey->keyIsNull = false;
#endif
    } else if (keyType == EVP_PKEY_DH) {
        // DH unsupported (key is null)
    } else {
        // error? (key is null)
    }

#ifndef OPENSSL_NO_DEPRECATED_3_0
    q_EVP_PKEY_free(pkey);
#endif

    return keyRaii.release();
}